

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O0

void __thiscall OpenMD::ElementsTable::ParseLine(ElementsTable *this,char *buffer)

{
  void *rvdw;
  char *in_RSI;
  Element *ele;
  RealType blue;
  RealType green;
  RealType red;
  RealType elAffin;
  RealType ionize;
  RealType ARENeg;
  RealType elNeg;
  RealType mass;
  RealType Rvdw;
  RealType Rcov;
  char name [256];
  char symbol [4];
  int maxbonds;
  int num;
  undefined1 *local_298;
  undefined4 *local_290;
  value_type *__x;
  vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *this_00;
  string *name_00;
  undefined1 *red_00;
  allocator<char> *__a;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 **mass_00;
  undefined1 *puVar1;
  int maxbo;
  undefined4 in_stack_fffffffffffffdd0;
  int num_00;
  undefined4 in_stack_fffffffffffffdf0;
  allocator<char> local_1a1;
  string local_1a0 [32];
  void *local_180;
  undefined8 local_178;
  undefined1 *local_170;
  undefined1 local_168 [8];
  undefined1 local_160 [32];
  value_type local_140;
  undefined1 local_138 [4];
  int iStack_134;
  char *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [8];
  undefined1 local_1c [4];
  undefined4 local_18;
  undefined4 local_14 [5];
  
  mass_00 = &local_298;
  if (*in_RSI != '#') {
    this_01 = local_128;
    __s = (char *)&local_178;
    __a = (allocator<char> *)&local_170;
    red_00 = local_168;
    name_00 = (string *)local_160;
    this_00 = (vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)(local_160 + 0x18);
    __x = &local_140;
    local_290 = &local_18;
    local_298 = local_138;
    puVar1 = local_1c;
    __isoc99_sscanf(in_RSI,"%d %3s %lf %lf %*f %lf %d %lf %lf %lf %lf %lf %lf %lf %255s",local_14,
                    puVar1,local_160 + 0x10,&local_130);
    maxbo = (int)((ulong)puVar1 >> 0x20);
    rvdw = operator_new(0xa0);
    num_00 = iStack_134;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
    local_290 = (undefined4 *)local_178;
    local_298 = local_170;
    Element::Element((Element *)CONCAT44(local_18,in_stack_fffffffffffffdf0),num_00,local_130,
                     (RealType)local_160._16_8_,
                     (RealType)CONCAT44(local_14[0],in_stack_fffffffffffffdd0),(RealType)rvdw,maxbo,
                     (RealType)mass_00,(RealType)this_01,(RealType)__s,(RealType)__a,
                     (RealType)red_00,(RealType)local_160._24_8_,(RealType)local_160._8_8_,name_00);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    local_180 = rvdw;
    std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::push_back(this_00,__x);
  }
  return;
}

Assistant:

void ElementsTable::ParseLine(const char* buffer) {
    int num, maxbonds;
    char symbol[4];
    char name[256];
    RealType Rcov, Rvdw, mass, elNeg, ARENeg, ionize, elAffin;
    RealType red, green, blue;

    // skip comment line (at the top)
    if (buffer[0] != '#') {
      sscanf(buffer,
             "%d %3s %lf %lf %*f %lf %d %lf %lf %lf %lf %lf %lf %lf %255s",
             &num, symbol, &ARENeg, &Rcov, &Rvdw, &maxbonds, &mass, &elNeg,
             &ionize, &elAffin, &red, &green, &blue, name);

      Element* ele =
          new Element(num, symbol, ARENeg, Rcov, Rvdw, maxbonds, mass, elNeg,
                      ionize, elAffin, red, green, blue, name);
      elements_.push_back(ele);
    }
  }